

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ED.cpp
# Opt level: O1

int * __thiscall ED::sortAnchorsByGradValue1(ED *this)

{
  size_t __n;
  int iVar1;
  uint uVar2;
  int iVar3;
  int *__s;
  int *__s_00;
  int i;
  long lVar4;
  short *psVar5;
  uchar *puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  __s = (int *)operator_new__(0x20000);
  memset(__s,0,0x20000);
  iVar1 = this->height;
  if (2 < iVar1) {
    uVar2 = this->width;
    psVar5 = this->gradImg;
    puVar6 = this->edgeImg;
    uVar7 = 1;
    do {
      psVar5 = psVar5 + uVar2;
      puVar6 = puVar6 + uVar2;
      if (2 < (int)uVar2) {
        uVar9 = 1;
        do {
          if (puVar6[uVar9] == 0xfe) {
            __s[psVar5[uVar9]] = __s[psVar5[uVar9]] + 1;
          }
          uVar9 = uVar9 + 1;
        } while (uVar2 - 1 != uVar9);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != iVar1 - 1);
  }
  iVar3 = *__s;
  lVar4 = 1;
  do {
    iVar3 = iVar3 + __s[lVar4];
    __s[lVar4] = iVar3;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x8000);
  __n = (long)__s[0x7fff] * 4;
  uVar7 = 0xffffffffffffffff;
  if (-1 < (long)__s[0x7fff]) {
    uVar7 = __n;
  }
  __s_00 = (int *)operator_new__(uVar7);
  memset(__s_00,0,__n);
  if (2 < iVar1) {
    uVar2 = this->width;
    uVar9 = (ulong)uVar2;
    psVar5 = this->gradImg;
    puVar6 = this->edgeImg;
    uVar8 = 1;
    uVar7 = uVar9;
    do {
      puVar6 = puVar6 + uVar9;
      psVar5 = psVar5 + uVar9;
      if (2 < (int)uVar2) {
        uVar10 = 1;
        do {
          if (puVar6[uVar10] == 0xfe) {
            iVar3 = __s[psVar5[uVar10]];
            __s[psVar5[uVar10]] = iVar3 + -1;
            __s_00[(long)iVar3 + -1] = (int)uVar7 + (int)uVar10;
          }
          uVar10 = uVar10 + 1;
        } while (uVar2 - 1 != uVar10);
      }
      uVar8 = uVar8 + 1;
      uVar7 = uVar7 + uVar9;
    } while (uVar8 != iVar1 - 1);
  }
  operator_delete__(__s);
  return __s_00;
}

Assistant:

int * ED::sortAnchorsByGradValue1()
{
	int SIZE = 128 * 256;
	int *C = new int[SIZE];
	memset(C, 0, sizeof(int)*SIZE);

	// Count the number of grad values
	for (int i = 1; i<height - 1; i++) {
		for (int j = 1; j<width - 1; j++) {
			if (edgeImg[i*width + j] != ANCHOR_PIXEL) continue;

			int grad = gradImg[i*width + j];
			C[grad]++;
		} //end-for
	} //end-for 

	// Compute indices
	for (int i = 1; i<SIZE; i++) C[i] += C[i - 1];

	int noAnchors = C[SIZE - 1];
	int *A = new int[noAnchors];
	memset(A, 0, sizeof(int)*noAnchors);


	for (int i = 1; i<height - 1; i++) {
		for (int j = 1; j<width - 1; j++) {
			if (edgeImg[i*width + j] != ANCHOR_PIXEL) continue;

			int grad = gradImg[i*width + j];
			int index = --C[grad];
			A[index] = i*width + j;    // anchor's offset 
		} //end-for
	} //end-for  

	delete[] C;

	/*
	ofstream myFile;
	myFile.open("aNew.txt");
	for (int i = 0; i < noAnchors; i++)
		myFile << A[i] << endl;

	myFile.close(); */

	return A;

}